

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::variable_storage_is_aliased(Compiler *this,SPIRVariable *v)

{
  uint32_t id;
  mapped_type *pmVar1;
  byte local_9a;
  byte local_99;
  bool local_79;
  Bitset local_68;
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  bool local_21;
  bool is_restrict;
  bool buffer_reference;
  bool counter;
  bool image;
  SPIRType *pSStack_20;
  bool ssbo;
  SPIRType *type;
  SPIRVariable *v_local;
  Compiler *this_local;
  
  type = (SPIRType *)v;
  v_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(v->super_IVariant).field_0xc);
  pSStack_20 = get<spirv_cross::SPIRType>(this,id);
  local_79 = true;
  if (type->basetype != Half) {
    pmVar1 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->ir).meta,&(pSStack_20->super_IVariant).self);
    local_79 = Bitset::get(&(pmVar1->decoration).decoration_flags,3);
  }
  local_21 = local_79;
  local_22 = pSStack_20->basetype == Image;
  local_23 = pSStack_20->basetype == AtomicCounter;
  local_24 = pSStack_20->storage == PhysicalStorageBuffer;
  if (local_79 == false) {
    local_25 = has_decoration(this,(ID)(type->super_IVariant).self.id,DecorationRestrict);
  }
  else {
    ParsedIR::get_buffer_block_flags(&local_68,&this->ir,(SPIRVariable *)type);
    local_25 = Bitset::get(&local_68,0x13);
    Bitset::~Bitset(&local_68);
  }
  local_99 = 0;
  if ((local_25 & 1) == 0) {
    local_9a = 1;
    if ((((local_21 & 1U) == 0) && (local_9a = 1, (local_22 & 1) == 0)) &&
       (local_9a = 1, (local_23 & 1) == 0)) {
      local_9a = local_24;
    }
    local_99 = local_9a;
  }
  return (bool)(local_99 & 1);
}

Assistant:

bool Compiler::variable_storage_is_aliased(const SPIRVariable &v)
{
	auto &type = get<SPIRType>(v.basetype);
	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;
	bool buffer_reference = type.storage == StorageClassPhysicalStorageBufferEXT;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter || buffer_reference);
}